

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::Inserter::insertOne
          (Inserter *this,qsizetype pos,TouchPoint *t)

{
  qsizetype in_RSI;
  TouchPoint *in_RDI;
  qsizetype i;
  TouchPoint *in_stack_ffffffffffffffe0;
  TouchPoint *this_00;
  
  setup((Inserter *)in_RDI,in_RSI,1);
  if ((in_RDI->normalPosition).yp == 0.0) {
    QWindowSystemInterface::TouchPoint::TouchPoint(in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->normalPosition).xp = (qreal)((long)(in_RDI->normalPosition).xp + 1);
    for (this_00 = (TouchPoint *)0x0; this_00 != (TouchPoint *)(in_RDI->area).yp;
        this_00 = (TouchPoint *)((long)&this_00[-1].rawPositions.d.size + 7)) {
      QWindowSystemInterface::TouchPoint::operator=(this_00,in_RDI);
    }
    QWindowSystemInterface::TouchPoint::operator=(this_00,in_RDI);
  }
  else {
    QWindowSystemInterface::TouchPoint::TouchPoint(in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->normalPosition).xp = (qreal)((long)(in_RDI->normalPosition).xp + 1);
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }